

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O3

void testAttrPreview(string *tempdir)

{
  int iVar1;
  exr_context_t p_Var2;
  long lVar3;
  undefined4 *puVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  char *in_RCX;
  char *pcVar8;
  _internal_exr_context *pctxt;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var2 = createDummyFile("<preview>");
  local_20 = p_Var2;
  if (p_Var2 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(p_Var2 + 0x40))
                      (p_Var2,3,"Invalid reference to preview object to initialize");
    if (iVar1 == 3) {
      pcVar8 = (char *)0xffffffff;
      iVar1 = (**(code **)(p_Var2 + 0x48))
                        (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0xffffffff,0x40,0xffffffff00);
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_preview_init (f, &p, (uint32_t) -1, 64)",(char *)0x325,0x17e20d,
                       pcVar8);
      }
      pcVar8 = (char *)0x40;
      iVar1 = (**(code **)(p_Var2 + 0x48))
                        (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0x40,0xffffffff,0xffffffff00);
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_preview_init (f, &p, 64, (uint32_t) -1)",(char *)0x328,0x17e20d,
                       pcVar8);
      }
      lVar3 = (**(code **)(p_Var2 + 0x58))(4);
      if (lVar3 == 0) {
        iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x329,0x17e20d,pcVar8);
        }
        core_test_fail("p.width == 1",(char *)0x32a,0x17e20d,pcVar8);
      }
      (**(code **)(p_Var2 + 0x60))(lVar3);
      s_malloc_fail_on = 1;
      lVar3 = (**(code **)(p_Var2 + 0x58))(4);
      if (lVar3 == 0) {
        iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
        s_malloc_fail_on = 0;
        if (iVar1 == 1) {
          puVar4 = (undefined4 *)(**(code **)(p_Var2 + 0x58))(4);
          if (puVar4 == (undefined4 *)0x0) {
            iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
            pcVar6 = (char *)exr_get_default_error_message(iVar1);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x336,0x17e20d,
                           pcVar8);
          }
          *puVar4 = 0xefbeadde;
          (**(code **)(p_Var2 + 0x60))(puVar4);
          s_malloc_fail_on = 1;
          puVar4 = (undefined4 *)(**(code **)(p_Var2 + 0x58))(4);
          if (puVar4 == (undefined4 *)0x0) {
            iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
            s_malloc_fail_on = 0;
            if (iVar1 == 1) {
              exr_finish(&local_20);
              return;
            }
          }
          else {
            *puVar4 = 0xefbeadde;
            iVar1 = 0;
          }
          s_malloc_fail_on = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x344,0x17e20d,
                         pcVar8);
        }
      }
      else {
        iVar1 = 0;
      }
      s_malloc_fail_on = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x334,0x17e20d,pcVar8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  pcVar8 = (char *)exr_get_default_error_message(iVar1);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  pcVar8 = (char *)exr_get_default_error_message(3);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  core_test_fail("exr_attr_preview_init (f, __null, 64, 64)",(char *)0x31f,0x17e20d,in_RCX);
}

Assistant:

void
testAttrPreview (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testPreviewHelper (NULL);
    exr_context_t f = createDummyFile ("<preview>");
    testPreviewHelper (f);
    exr_finish (&f);
}